

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode Curl_connecthost(connectdata *conn,Curl_dns_entry *remotehost)

{
  int iVar1;
  long local_50;
  long timeout_ms;
  undefined1 auStack_38 [4];
  CURLcode res;
  timeval before;
  SessionHandle *data;
  Curl_dns_entry *remotehost_local;
  connectdata *conn_local;
  
  before.tv_usec = (__suseconds_t)conn->data;
  _auStack_38 = curlx_tvnow();
  timeout_ms._4_4_ = CURLE_COULDNT_CONNECT;
  local_50 = Curl_timeleft((SessionHandle *)before.tv_usec,(timeval *)auStack_38,true);
  if (local_50 < 0) {
    Curl_failf((SessionHandle *)before.tv_usec,"Connection time-out");
    conn_local._4_4_ = CURLE_OPERATION_TIMEDOUT;
  }
  else {
    iVar1 = Curl_num_addresses(remotehost->addr);
    conn->num_addr = iVar1;
    conn->tempaddr[0] = remotehost->addr;
    conn->tempaddr[1] = (Curl_addrinfo *)0x0;
    conn->tempsock[0] = -1;
    conn->tempsock[1] = -1;
    Curl_expire(conn->data,200);
    if (conn->tempaddr[0]->ai_next != (Curl_addrinfo *)0x0) {
      local_50 = local_50 / 2;
    }
    conn->timeoutms_per_addr = local_50;
    while ((conn->tempaddr[0] != (Curl_addrinfo *)0x0 &&
           (timeout_ms._4_4_ = singleipconnect(conn,conn->tempaddr[0],conn->tempsock),
           timeout_ms._4_4_ != CURLE_OK))) {
      conn->tempaddr[0] = conn->tempaddr[0]->ai_next;
    }
    if (conn->tempsock[0] == -1) {
      conn_local._4_4_ = timeout_ms._4_4_;
    }
    else {
      *(long *)(before.tv_usec + 0x8ae8) = *(long *)(before.tv_usec + 0x8ae8) + 1;
      conn_local._4_4_ = CURLE_OK;
    }
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_connecthost(struct connectdata *conn,  /* context */
                          const struct Curl_dns_entry *remotehost)
{
  struct SessionHandle *data = conn->data;
  struct timeval before = Curl_tvnow();
  CURLcode res = CURLE_COULDNT_CONNECT;

  long timeout_ms = Curl_timeleft(data, &before, TRUE);

  if(timeout_ms < 0) {
    /* a precaution, no need to continue if time already is up */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  conn->num_addr = Curl_num_addresses(remotehost->addr);
  conn->tempaddr[0] = remotehost->addr;
  conn->tempaddr[1] = NULL;
  conn->tempsock[0] = CURL_SOCKET_BAD;
  conn->tempsock[1] = CURL_SOCKET_BAD;
  Curl_expire(conn->data, HAPPY_EYEBALLS_TIMEOUT);

  /* Max time for the next connection attempt */
  conn->timeoutms_per_addr =
    conn->tempaddr[0]->ai_next == NULL ? timeout_ms : timeout_ms / 2;

  /* start connecting to first IP */
  while(conn->tempaddr[0]) {
    res = singleipconnect(conn, conn->tempaddr[0], &(conn->tempsock[0]));
    if(res == CURLE_OK)
        break;
    conn->tempaddr[0] = conn->tempaddr[0]->ai_next;
  }

  if(conn->tempsock[0] == CURL_SOCKET_BAD)
    return res;

  data->info.numconnects++; /* to track the number of connections made */

  return CURLE_OK;
}